

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O3

void av1_highbd_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  short *psVar1;
  short *psVar2;
  int *piVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint8_t *puVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  undefined7 in_register_00000011;
  long lVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 *puVar33;
  long lVar34;
  int *piVar35;
  ulong uVar36;
  int *piVar37;
  int iVar38;
  int *piVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  ulong uVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  int iVar53;
  undefined1 auVar52 [16];
  int iVar54;
  double dVar55;
  double dVar58;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar60;
  undefined1 auVar59 [16];
  int iVar61;
  double dVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  undefined1 auVar80 [16];
  double d_factor [4];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  uint32_t frame_sse [1152];
  uint local_3430;
  int local_340c;
  double local_33b0;
  undefined8 local_3348;
  undefined8 local_3340;
  int local_3338 [7];
  int iStack_331c;
  int local_3318;
  int iStack_3314;
  int iStack_3310;
  int iStack_330c;
  int local_3308;
  int iStack_3304;
  int iStack_3300;
  int iStack_32fc;
  int local_32f8 [24];
  double local_3298 [8];
  double adStack_3258 [4];
  int local_3238 [1024];
  undefined1 local_2238 [8];
  int aiStack_2230 [1022];
  int local_1238 [1154];
  
  uVar31 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar5 = block_size_high[uVar31];
  bVar6 = block_size_wide[uVar31];
  iVar40 = (frame_to_filter->field_2).field_0.y_crop_width;
  dVar62 = (double)q_factor / 20.0;
  iVar41 = (frame_to_filter->field_3).field_0.y_crop_height;
  dVar62 = dVar62 * dVar62;
  dVar51 = 1.0;
  if (dVar62 <= 1.0) {
    dVar51 = dVar62;
  }
  dVar55 = (double)q_factor * 0.015625;
  dVar46 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  dVar50 = 1.0;
  if (dVar46 <= 1.0) {
    dVar50 = dVar46;
  }
  local_3298[2] = 0.0;
  local_3298[3] = 0.0;
  local_3298[0] = 0.0;
  local_3298[1] = 0.0;
  lVar43 = 0;
  memset(local_1238,0,0x1200);
  memset(local_3238,0,0x1000);
  if (iVar41 < iVar40) {
    iVar40 = iVar41;
  }
  dVar47 = (double)iVar40 * 0.1;
  if (dVar47 <= 1.0) {
    dVar47 = 1.0;
  }
  auVar49._8_8_ = dVar47;
  auVar49._0_8_ = dVar47;
  do {
    uVar4 = *(undefined8 *)(subblock_mvs + lVar43);
    dVar60 = (double)(int)(short)((ulong)uVar4 >> 0x20);
    dVar47 = (double)((int)uVar4 >> 0x10);
    dVar58 = (double)(int)((long)uVar4 >> 0x30);
    auVar56._0_8_ = dVar47 * dVar47 + (double)(int)(short)uVar4 * (double)(int)(short)uVar4;
    auVar56._8_8_ = dVar58 * dVar58 + dVar60 * dVar60;
    auVar56 = sqrtpd(auVar56,auVar56);
    auVar56 = divpd(auVar56,auVar49);
    auVar56 = maxpd(auVar56,_DAT_004d88e0);
    *(undefined1 (*) [16])(local_3298 + lVar43) = auVar56;
    lVar43 = lVar43 + 2;
  } while (lVar43 != 4);
  local_33b0 = dVar55 * dVar55 * 0.5;
  if (q_factor < 0x80) {
    local_33b0 = (double)(-(ulong)(dVar62 < 1e-05) & 0x3ee4f8b588e368f1 |
                         ~-(ulong)(dVar62 < 1e-05) & (ulong)dVar51);
  }
  if (0 < num_planes) {
    uVar31 = 0;
    local_340c = 0;
    do {
      iVar40 = mbd->plane[uVar31].subsampling_x;
      iVar41 = mbd->plane[uVar31].subsampling_y;
      bVar13 = bVar5 >> ((byte)iVar41 & 0x1f);
      uVar23 = (uint)bVar13;
      bVar14 = bVar6 >> ((byte)iVar40 & 0x1f);
      uVar25 = (ulong)bVar14;
      iVar40 = iVar40 - mbd->plane[0].subsampling_x;
      iVar41 = iVar41 - mbd->plane[0].subsampling_y;
      bVar10 = (byte)iVar40;
      bVar11 = (byte)iVar41;
      dVar51 = 0.04;
      if (uVar31 != 0) {
        dVar51 = 1.0 / (double)((1 << (bVar10 + bVar11 & 0x1f)) + 0x19);
      }
      uVar8 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar31 != 0) * 4 + -0x28);
      puVar9 = frame_to_filter->store_buf_adr[uVar31 - 4];
      dVar62 = log(noise_levels[uVar31] + noise_levels[uVar31] + 5.0);
      if ((uVar31 == 1) && (uVar23 != 0)) {
        uVar24 = 1 << (bVar11 & 0x1f);
        uVar27 = 1 << (bVar10 & 0x1f);
        if ((int)uVar27 < 2) {
          uVar27 = 1;
        }
        if ((int)uVar24 < 2) {
          uVar24 = 1;
        }
        uVar32 = 0;
        do {
          if (bVar14 != 0) {
            uVar36 = 0;
            do {
              if (iVar41 != 0x1f) {
                iVar38 = ((int)uVar36 << (bVar10 & 0x1f)) +
                         ((int)uVar32 << (bVar11 & 0x1f)) * 0x24 + 2;
                lVar43 = uVar36 + uVar32 * 0x20;
                uVar29 = 0;
                do {
                  if (iVar40 != 0x1f) {
                    iVar42 = local_3238[lVar43];
                    uVar44 = (ulong)uVar27;
                    iVar30 = iVar38;
                    do {
                      iVar42 = iVar42 + local_1238[iVar30];
                      iVar30 = iVar30 + 1;
                      uVar44 = uVar44 - 1;
                    } while (uVar44 != 0);
                    local_3238[lVar43] = iVar42;
                  }
                  uVar29 = uVar29 + 1;
                  iVar38 = iVar38 + 0x24;
                } while (uVar29 != uVar24);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar25);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar23);
      }
      lVar26 = (long)local_340c;
      lVar43 = (long)pred * 2 + lVar26 * 2;
      iVar40 = mbd->bd;
      local_3430 = (uint)bVar14;
      uVar27 = local_3430;
      if (uVar23 != 0) {
        lVar28 = (long)(int)(local_3430 * mb_col + uVar8 * uVar23 * mb_row) * 2 + (long)puVar9 * 2;
        uVar24 = 0;
        piVar35 = local_1238;
        lVar34 = lVar43;
        do {
          if (local_3430 != 0) {
            uVar32 = 0;
            do {
              psVar1 = (short *)(lVar28 + uVar32 * 2);
              psVar2 = (short *)(lVar34 + uVar32 * 2);
              auVar48._0_2_ = *psVar1 - *psVar2;
              auVar48._2_2_ = psVar1[1] - psVar2[1];
              auVar48._4_2_ = psVar1[2] - psVar2[2];
              auVar48._6_2_ = psVar1[3] - psVar2[3];
              auVar48._8_2_ = psVar1[4] - psVar2[4];
              auVar48._10_2_ = psVar1[5] - psVar2[5];
              auVar48._12_2_ = psVar1[6] - psVar2[6];
              auVar48._14_2_ = psVar1[7] - psVar2[7];
              auVar49 = pmulhw(auVar48,auVar48);
              auVar57._8_8_ =
                   (undefined8)
                   (CONCAT64(CONCAT42(CONCAT22(auVar49._6_2_,auVar48._6_2_ * auVar48._6_2_),
                                      auVar49._4_2_),
                             CONCAT22(auVar48._4_2_ * auVar48._4_2_,auVar48._6_2_ * auVar48._6_2_))
                   >> 0x10);
              auVar57._6_2_ = auVar49._2_2_;
              auVar57._4_2_ = auVar48._2_2_ * auVar48._2_2_;
              auVar57._2_2_ = auVar49._0_2_;
              auVar57._0_2_ = auVar48._0_2_ * auVar48._0_2_;
              auVar52._2_2_ = auVar49._8_2_;
              auVar52._0_2_ = auVar48._8_2_ * auVar48._8_2_;
              auVar52._4_2_ = auVar48._10_2_ * auVar48._10_2_;
              auVar52._6_2_ = auVar49._10_2_;
              auVar52._8_2_ = auVar48._12_2_ * auVar48._12_2_;
              auVar52._10_2_ = auVar49._12_2_;
              auVar52._12_2_ = auVar48._14_2_ * auVar48._14_2_;
              auVar52._14_2_ = auVar49._14_2_;
              *(undefined1 (*) [16])(piVar35 + uVar32 + 2) = auVar57;
              *(undefined1 (*) [16])(piVar35 + uVar32 + 6) = auVar52;
              uVar32 = uVar32 + 8;
            } while (uVar32 < uVar25);
          }
          piVar35 = piVar35 + 0x24;
          uVar24 = uVar24 + 1;
          lVar34 = lVar34 + (ulong)(local_3430 * 2);
          lVar28 = lVar28 + (ulong)uVar8 * 2;
        } while (uVar24 != uVar23);
      }
      if (local_3430 != 0) {
        puVar33 = local_2238 + (ulong)bVar13 * 0x80;
        piVar35 = aiStack_2230;
        uVar32 = 0;
        do {
          lVar28 = 0x50;
          piVar39 = local_1238 + uVar32;
          do {
            piVar37 = piVar39;
            iVar41 = piVar37[2];
            iVar38 = piVar37[3];
            iVar42 = *piVar37;
            iVar30 = piVar37[1];
            if (uVar32 == 0) {
              iVar42 = iVar41;
              iVar30 = iVar41;
            }
            iVar61 = piVar37[4];
            iVar63 = piVar37[5];
            iVar53 = piVar37[6];
            iVar54 = piVar37[7];
            *(int *)((long)&local_3348 + lVar28) = iVar42;
            *(int *)((long)&local_3348 + lVar28 + 4) = iVar30;
            *(int *)((long)&local_3340 + lVar28) = iVar41;
            *(int *)((long)&local_3340 + lVar28 + 4) = iVar38;
            if ((long)(int)(local_3430 - 4) <= (long)uVar32) {
              iVar53 = iVar63;
              iVar54 = iVar63;
            }
            *(int *)((long)local_3338 + lVar28) = iVar61;
            *(int *)((long)local_3338 + lVar28 + 4) = iVar63;
            *(int *)((long)local_3338 + lVar28 + 8) = iVar53;
            *(int *)((long)local_3338 + lVar28 + 0xc) = iVar54;
            lVar28 = lVar28 + 0x20;
            piVar39 = piVar37 + 0x24;
          } while (lVar28 != 0xb0);
          local_3318 = local_32f8[0];
          iStack_3314 = local_32f8[1];
          iStack_3310 = local_32f8[2];
          iStack_330c = local_32f8[3];
          iVar41 = local_32f8[0];
          iVar38 = local_32f8[1];
          iVar42 = local_32f8[2];
          iVar30 = local_32f8[3];
          local_3308 = local_32f8[4];
          iStack_3304 = local_32f8[5];
          iStack_3300 = local_32f8[6];
          iStack_32fc = local_32f8[7];
          iVar61 = local_32f8[4];
          iVar63 = local_32f8[5];
          iVar53 = local_32f8[6];
          iVar54 = local_32f8[7];
          if (3 < uVar23) {
            lVar28 = 0;
            piVar39 = piVar35;
            iVar73 = local_32f8[0];
            iVar75 = local_32f8[1];
            iVar77 = local_32f8[2];
            iVar79 = local_32f8[3];
            iVar65 = local_32f8[8];
            iVar67 = local_32f8[9];
            iVar69 = local_32f8[10];
            iVar71 = local_32f8[0xb];
            iVar72 = local_32f8[0];
            iVar74 = local_32f8[1];
            iVar76 = local_32f8[2];
            iVar78 = local_32f8[3];
            local_32f8[0x10] = local_32f8[0x10];
            local_32f8[0x11] = local_32f8[0x11];
            local_32f8[0x12] = local_32f8[0x12];
            local_32f8[0x13] = local_32f8[0x13];
            iVar15 = local_32f8[4];
            iVar16 = local_32f8[5];
            iVar17 = local_32f8[6];
            iVar18 = local_32f8[7];
            iVar19 = local_32f8[0xc];
            iVar20 = local_32f8[0xd];
            iVar21 = local_32f8[0xe];
            iVar22 = local_32f8[0xf];
            iVar64 = local_32f8[4];
            iVar66 = local_32f8[5];
            iVar68 = local_32f8[6];
            iVar70 = local_32f8[7];
            local_32f8[0x14] = local_32f8[0x14];
            local_32f8[0x15] = local_32f8[0x15];
            local_32f8[0x16] = local_32f8[0x16];
            local_32f8[0x17] = local_32f8[0x17];
            do {
              local_32f8[0xf] = local_32f8[0x17];
              local_32f8[0xe] = local_32f8[0x16];
              local_32f8[0xd] = local_32f8[0x15];
              local_32f8[0xc] = local_32f8[0x14];
              local_32f8[7] = iStack_32fc;
              local_32f8[6] = iStack_3300;
              local_32f8[5] = iStack_3304;
              local_32f8[4] = local_3308;
              iVar54 = iVar22;
              iVar53 = iVar21;
              iVar63 = iVar20;
              iVar61 = iVar19;
              iStack_32fc = iVar18;
              iStack_3300 = iVar17;
              iStack_3304 = iVar16;
              local_3308 = iVar15;
              local_32f8[0xb] = local_32f8[0x13];
              local_32f8[10] = local_32f8[0x12];
              local_32f8[9] = local_32f8[0x11];
              local_32f8[8] = local_32f8[0x10];
              local_32f8[3] = iStack_330c;
              local_32f8[2] = iStack_3310;
              local_32f8[1] = iStack_3314;
              local_32f8[0] = local_3318;
              iVar30 = iVar71;
              iVar42 = iVar69;
              iVar38 = iVar67;
              iVar41 = iVar65;
              iStack_330c = iVar79;
              iStack_3310 = iVar77;
              iStack_3314 = iVar75;
              local_3318 = iVar73;
              piVar3 = (int *)((long)(piVar37 + 0x24) + lVar28);
              local_32f8[0x12] = piVar3[2];
              local_32f8[0x13] = piVar3[3];
              local_32f8[0x10] = *piVar3;
              local_32f8[0x11] = piVar3[1];
              if (uVar32 == 0) {
                local_32f8[0x10] = local_32f8[0x12];
                local_32f8[0x11] = local_32f8[0x12];
              }
              piVar3 = (int *)((long)piVar37 + lVar28 + 0xa0);
              local_32f8[0x14] = *piVar3;
              local_32f8[0x15] = piVar3[1];
              local_32f8[0x16] = piVar3[2];
              local_32f8[0x17] = piVar3[3];
              if ((long)(int)(local_3430 - 4) <= (long)uVar32) {
                local_32f8[0x16] = local_32f8[0x15];
                local_32f8[0x17] = local_32f8[0x15];
              }
              auVar80._0_4_ = local_32f8[0] + iVar41 + iVar72 + local_32f8[8] + local_3318;
              auVar80._4_4_ = local_32f8[1] + iVar38 + iVar74 + local_32f8[9] + iStack_3314;
              auVar80._8_4_ = local_32f8[2] + iVar42 + iVar76 + local_32f8[10] + iStack_3310;
              auVar80._12_4_ = local_32f8[3] + iVar30 + iVar78 + local_32f8[0xb] + iStack_330c;
              iVar73 = local_32f8[4] + iVar61 + iVar64 + local_32f8[0xc] + local_3308;
              iVar75 = local_32f8[5] + iVar63 + iVar66 + local_32f8[0xd] + iStack_3304;
              iVar77 = local_32f8[6] + iVar53 + iVar68 + local_32f8[0xe] + iStack_3300;
              auVar49 = auVar80 & _DAT_00566d40;
              auVar56 = auVar80 & _DAT_00566d60;
              piVar39[-2] = auVar80._12_4_ + auVar80._4_4_ + auVar80._8_4_ + iVar73 + auVar80._0_4_;
              piVar39[-1] = auVar49._12_4_ + iVar75 + auVar49._4_4_ +
                            auVar49._8_4_ + iVar73 + auVar49._0_4_;
              *piVar39 = auVar80._12_4_ + iVar75 + iVar77 + auVar80._8_4_ + iVar73;
              piVar39[1] = auVar56._12_4_ +
                           local_32f8[7] + iVar54 + iVar70 + local_32f8[0xf] + iStack_32fc +
                           auVar56._4_4_ + iVar75 + auVar56._8_4_ + iVar77 + auVar56._0_4_ + iVar73;
              lVar28 = lVar28 + 0x90;
              piVar39 = piVar39 + 0x20;
              iVar73 = iVar41;
              iVar75 = iVar38;
              iVar77 = iVar42;
              iVar79 = iVar30;
              iVar65 = local_32f8[8];
              iVar67 = local_32f8[9];
              iVar69 = local_32f8[10];
              iVar71 = local_32f8[0xb];
              iVar72 = local_32f8[0];
              iVar74 = local_32f8[1];
              iVar76 = local_32f8[2];
              iVar78 = local_32f8[3];
              iVar15 = iVar61;
              iVar16 = iVar63;
              iVar17 = iVar53;
              iVar18 = iVar54;
              iVar19 = local_32f8[0xc];
              iVar20 = local_32f8[0xd];
              iVar21 = local_32f8[0xe];
              iVar22 = local_32f8[0xf];
              iVar64 = local_32f8[4];
              iVar66 = local_32f8[5];
              iVar68 = local_32f8[6];
              iVar70 = local_32f8[7];
            } while ((ulong)(uVar23 - 3) * 0x90 != lVar28);
          }
          lVar28 = -0x180;
          iVar73 = local_32f8[0];
          iVar75 = local_32f8[1];
          iVar77 = local_32f8[2];
          iVar79 = local_32f8[3];
          iVar65 = local_32f8[4];
          iVar67 = local_32f8[5];
          iVar69 = local_32f8[6];
          iVar71 = local_32f8[7];
          do {
            iStack_331c = iStack_32fc;
            local_3338[6] = iStack_3300;
            local_3338[5] = iStack_3304;
            local_3338[4] = local_3308;
            iStack_32fc = iVar54;
            iStack_3300 = iVar53;
            iStack_3304 = iVar63;
            local_3308 = iVar61;
            local_32f8[7] = local_32f8[0xf];
            local_32f8[6] = local_32f8[0xe];
            local_32f8[5] = local_32f8[0xd];
            local_32f8[4] = local_32f8[0xc];
            local_3338[3] = iStack_330c;
            local_3338[2] = iStack_3310;
            local_3338[1] = iStack_3314;
            local_3338[0] = local_3318;
            iStack_330c = iVar30;
            iStack_3310 = iVar42;
            iStack_3314 = iVar38;
            local_3318 = iVar41;
            local_32f8[3] = local_32f8[0xb];
            local_32f8[2] = local_32f8[10];
            local_32f8[1] = local_32f8[9];
            local_32f8[0] = local_32f8[8];
            auVar59._0_4_ = local_3338[0] + local_3318 + iVar73 + local_32f8[0x10] + local_32f8[0];
            auVar59._4_4_ = local_3338[1] + iStack_3314 + iVar75 + local_32f8[0x11] + local_32f8[1];
            auVar59._8_4_ = local_3338[2] + iStack_3310 + iVar77 + local_32f8[0x12] + local_32f8[2];
            auVar59._12_4_ = local_3338[3] + iStack_330c + iVar79 + local_32f8[0x13] + local_32f8[3]
            ;
            iVar41 = local_3338[4] + local_3308 + iVar65 + local_32f8[0x14] + local_32f8[4];
            iVar38 = local_3338[5] + iStack_3304 + iVar67 + local_32f8[0x15] + local_32f8[5];
            iVar42 = local_3338[6] + iStack_3300 + iVar69 + local_32f8[0x16] + local_32f8[6];
            auVar56 = auVar59 & _DAT_00566d40;
            auVar49 = auVar59 & _DAT_00566d60;
            piVar39 = (int *)(puVar33 + lVar28);
            *piVar39 = auVar59._12_4_ + auVar59._4_4_ + auVar59._8_4_ + iVar41 + auVar59._0_4_;
            piVar39[1] = auVar56._12_4_ + iVar38 + auVar56._4_4_ +
                         auVar56._8_4_ + iVar41 + auVar56._0_4_;
            piVar39[2] = auVar59._12_4_ + iVar38 + iVar42 + auVar59._8_4_ + iVar41;
            piVar39[3] = auVar49._12_4_ +
                         iStack_331c + iStack_32fc + iVar71 + local_32f8[0x17] + local_32f8[7] +
                         auVar49._4_4_ + iVar38 + auVar49._8_4_ + iVar42 + auVar49._0_4_ + iVar41;
            lVar28 = lVar28 + 0x80;
            local_32f8[8] = local_32f8[0x10];
            local_32f8[9] = local_32f8[0x11];
            local_32f8[10] = local_32f8[0x12];
            local_32f8[0xb] = local_32f8[0x13];
            iVar41 = local_32f8[0];
            iVar38 = local_32f8[1];
            iVar42 = local_32f8[2];
            iVar30 = local_32f8[3];
            iVar73 = local_3338[0];
            iVar75 = local_3338[1];
            iVar77 = local_3338[2];
            iVar79 = local_3338[3];
            local_32f8[0xc] = local_32f8[0x14];
            local_32f8[0xd] = local_32f8[0x15];
            local_32f8[0xe] = local_32f8[0x16];
            local_32f8[0xf] = local_32f8[0x17];
            iVar61 = local_32f8[4];
            iVar63 = local_32f8[5];
            iVar53 = local_32f8[6];
            iVar54 = local_32f8[7];
            iVar65 = local_3338[4];
            iVar67 = local_3338[5];
            iVar69 = local_3338[6];
            iVar71 = iStack_331c;
          } while (lVar28 != 0);
          uVar32 = uVar32 + 4;
          piVar35 = piVar35 + 4;
          puVar33 = puVar33 + 0x10;
        } while (uVar32 < uVar25);
      }
      dVar62 = 1.0 / ((dVar62 + 0.5) * local_33b0 *
                     (double)(~-(ulong)(dVar46 < 1e-05) & (ulong)dVar50 |
                             -(ulong)(dVar46 < 1e-05) & 0x3ee4f8b588e368f1));
      lVar28 = 0;
      do {
        uVar4 = *(undefined8 *)(subblock_mses + lVar28);
        local_3298[lVar28 + 8] = (double)(int)uVar4 * (double)DAT_00566c30;
        local_3298[lVar28 + 9] = (double)(int)((ulong)uVar4 >> 0x20) * DAT_00566c30._8_8_;
        local_3298[lVar28 + 4] = local_3298[lVar28] * dVar62;
        local_3298[lVar28 + 5] = local_3298[lVar28 + 1] * dVar62;
        lVar28 = lVar28 + 2;
      } while (lVar28 != 4);
      cVar12 = (char)iVar40;
      local_3430 = (uint)bVar14;
      if (tf_wgt_calc_lvl == 0) {
        if (uVar23 != 0) {
          local_3348 = (ulong)(bVar13 >> 1);
          uVar32 = 0;
          puVar33 = local_2238;
          piVar35 = local_3238;
          iVar40 = 0;
          auVar49 = _DAT_004ce4b0;
          do {
            bVar45 = local_3348 <= uVar32;
            if (local_3430 != 0) {
              uVar36 = 0;
              local_3340 = uVar32;
              do {
                uVar7 = *(ushort *)(lVar43 + uVar36 * 2);
                uVar32 = (ulong)(((uint)(bVar14 >> 1 <= uVar36) | (uint)bVar45 * 2) << 3);
                dVar62 = ((double)((uint)(piVar35[uVar36] + *(int *)(puVar33 + uVar36 * 4)) >>
                                  (cVar12 * '\x02' - 0x10U & 0x1f)) * dVar51 * 0.041666666666666664
                         + *(double *)((long)local_3298 + uVar32 + 0x40)) *
                         *(double *)((long)local_3298 + uVar32 + 0x20);
                uVar32 = -(ulong)(dVar62 < 7.0);
                dVar62 = exp((double)(~uVar32 & 0xc01c000000000000 |
                                     ((ulong)dVar62 ^ auVar49._0_8_) & uVar32));
                auVar49 = _DAT_004ce4b0;
                count[lVar26 + (long)iVar40 + uVar36] =
                     count[lVar26 + (long)iVar40 + uVar36] + (short)(int)(dVar62 * 1000.0);
                accum[lVar26 + (long)iVar40 + uVar36] =
                     accum[lVar26 + (long)iVar40 + uVar36] + (uint)uVar7 * (int)(dVar62 * 1000.0);
                uVar36 = uVar36 + 1;
              } while (uVar25 != uVar36);
              iVar40 = iVar40 + (int)uVar36;
              uVar32 = local_3340;
            }
            uVar32 = uVar32 + 1;
            piVar35 = piVar35 + 0x20;
            puVar33 = puVar33 + 0x80;
            lVar43 = lVar43 + (ulong)(uVar27 * 2);
          } while (uVar32 != uVar23);
        }
      }
      else if (uVar23 != 0) {
        uVar32 = 0;
        puVar33 = local_2238;
        piVar35 = local_3238;
        iVar40 = 0;
        do {
          if (uVar27 != 0) {
            uVar36 = 0;
            do {
              uVar44 = (ulong)(((uint)(bVar14 >> 1 <= uVar36) | (uint)(bVar13 >> 1 <= uVar32) * 2)
                              << 3);
              dVar62 = ((double)((uint)(piVar35[uVar36] + *(int *)(puVar33 + uVar36 * 4)) >>
                                (cVar12 * '\x02' - 0x10U & 0x1f)) * dVar51 * 0.041666666666666664 +
                       *(double *)((long)local_3298 + uVar44 + 0x40)) *
                       *(double *)((long)local_3298 + uVar44 + 0x20);
              if (7.0 <= dVar62) {
                dVar62 = 7.0;
              }
              iVar41 = (int)((float)((int)((float)dVar62 * -12102203.0) + 0x3f7f127f) * 1000.0 + 0.5
                            );
              uVar7 = *(ushort *)(lVar43 + uVar36 * 2);
              count[lVar26 + (long)iVar40 + uVar36] =
                   count[lVar26 + (long)iVar40 + uVar36] + (short)iVar41;
              accum[lVar26 + (long)iVar40 + uVar36] =
                   accum[lVar26 + (long)iVar40 + uVar36] + (uint)uVar7 * iVar41;
              uVar36 = uVar36 + 1;
            } while (uVar25 != uVar36);
            iVar40 = iVar40 + (int)uVar36;
          }
          uVar32 = uVar32 + 1;
          piVar35 = piVar35 + 0x20;
          puVar33 = puVar33 + 0x80;
          lVar43 = lVar43 + (ulong)(uVar27 * 2);
        } while (uVar32 != uVar23);
      }
      local_340c = local_340c + local_3430 * uVar23;
      uVar31 = uVar31 + 1;
    } while (uVar31 != (uint)num_planes);
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[0].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[0].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}